

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutList.h
# Opt level: O2

Cut_Cut_t * Cut_ListFinish(Cut_List_t *p)

{
  Cut_Cut_t *pCVar1;
  Cut_Cut_t **ppCVar2;
  long lVar3;
  Cut_Cut_t *pHead;
  
  ppCVar2 = &pHead;
  pHead = (Cut_Cut_t *)0x0;
  for (lVar3 = -0x60; lVar3 != 0; lVar3 = lVar3 + 8) {
    pCVar1 = *(Cut_Cut_t **)((long)p->ppTail + lVar3);
    if (pCVar1 != (Cut_Cut_t *)0x0) {
      *ppCVar2 = pCVar1;
      ppCVar2 = *(Cut_Cut_t ***)((long)p[1].pHead + lVar3);
    }
  }
  *ppCVar2 = (Cut_Cut_t *)0x0;
  return pHead;
}

Assistant:

static inline Cut_Cut_t * Cut_ListFinish( Cut_List_t * p )
{
    Cut_Cut_t * pHead = NULL, ** ppTail = &pHead;
    int i;
    for ( i = 1; i <= CUT_SIZE_MAX; i++ )
    {
        if ( p->pHead[i] == NULL )
            continue;
        *ppTail = p->pHead[i];
        ppTail = p->ppTail[i];
    }
    *ppTail = NULL;
    return pHead;
}